

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

void raviV_op_shl(lua_State *L,TValue *ra,TValue *rb,TValue *rc)

{
  int iVar1;
  lua_Integer lVar2;
  TValue *pTVar3;
  lua_Integer ib;
  lua_Integer ic;
  
  if (rb->tt_ == 0x13) {
    ib = (rb->value_).i;
  }
  else {
    iVar1 = luaV_tointegerns(rb,&ib,F2Ieq);
    if (iVar1 == 0) goto LAB_00146358;
  }
  pTVar3 = rc;
  if (rc->tt_ != 0x13) {
    iVar1 = luaV_tointegerns(rc,&ic,F2Ieq);
    pTVar3 = (TValue *)&ic;
    if (iVar1 == 0) {
LAB_00146358:
      luaT_trybinTM(L,rb,rc,ra,TM_SHL);
      return;
    }
  }
  lVar2 = luaV_shiftl(ib,(pTVar3->value_).i);
  (ra->value_).i = lVar2;
  ra->tt_ = 0x13;
  return;
}

Assistant:

void raviV_op_shl(lua_State *L, TValue *ra, TValue *rb, TValue *rc) {
  lua_Integer ib;
  lua_Integer ic;
  if (tointegerns(rb, &ib) && tointegerns(rc, &ic)) {
    setivalue(ra, luaV_shiftl(ib, ic));
  }
  else {
    luaT_trybinTM(L, rb, rc, ra, TM_SHL);
  }
}